

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  char cVar1;
  int64_t iVar2;
  char __s [8];
  uint16_t uVar3;
  uint16_t uVar4;
  undefined4 uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  wchar_t wVar10;
  archive_string_conv *paVar11;
  undefined4 *puVar12;
  int64_t *piVar13;
  time_t tVar14;
  uint64_t uVar15;
  void *pvVar16;
  ulong uVar17;
  char *pcVar18;
  size_t sVar19;
  data_block_offsets *pdVar20;
  int *piVar21;
  uint uVar22;
  uint uVar23;
  bool local_105;
  data_block_offsets *newdbo;
  char local_e7;
  char local_e6;
  char local_e5;
  uint cp;
  uint8_t length;
  char high;
  char extra;
  uint offset;
  uint fn_end;
  uchar flagbyte;
  uchar flagbits;
  uchar highbyte;
  size_t distance;
  size_t newsize;
  char *newptr;
  int ret2;
  int ret;
  uint32_t crc32_read;
  uint32_t crc32_computed;
  archive_string_conv *fn_sconv;
  archive_string_conv *sconv;
  undefined4 local_98;
  int ttime;
  char unp_size [8];
  char packed_size [8];
  char *strp;
  char *filename;
  uint end;
  uint filename_size;
  int64_t header_size;
  rar_file_header file_header;
  rar_header rar_header;
  rar *rar;
  char *endp;
  char *p;
  void *h;
  char head_type_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  newptr._4_4_ = 0;
  unique0x00012000 = (rar *)a->format->data;
  fn_sconv = unique0x00012000->opt_sconv;
  if (fn_sconv == (archive_string_conv *)0x0) {
    if (unique0x00012000->init_default_conversion == 0) {
      paVar11 = archive_string_default_conversion_for_read(&a->archive);
      stack0xffffffffffffffb8->sconv_default = paVar11;
      stack0xffffffffffffffb8->init_default_conversion = 1;
    }
    fn_sconv = stack0xffffffffffffffb8->sconv_default;
  }
  puVar12 = (undefined4 *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (puVar12 == (undefined4 *)0x0) {
    a_local._4_4_ = -0x1e;
  }
  else {
    file_header._17_4_ = *puVar12;
    file_header.file_attr._0_2_ = *(undefined2 *)(puVar12 + 1);
    file_header.file_attr[2] = *(char *)((long)puVar12 + 6);
    uVar3 = archive_le16dec(file_header.name_size + 1);
    stack0xffffffffffffffb8->file_flags = (uint)uVar3;
    uVar3 = archive_le16dec(file_header.file_attr + 1);
    _end = (ulong)uVar3;
    if (_end < 0x20) {
      archive_set_error(&a->archive,0x54,"Invalid header size");
      a_local._4_4_ = -0x1e;
    }
    else {
      uVar5 = crc32(0,(long)puVar12 + 2,5);
      __archive_read_consume(a,7);
      if ((stack0xffffffffffffffb8->file_flags & 0x10) == 0) {
        stack0xffffffffffffffb8->compression_method = '\0';
        stack0xffffffffffffffb8->packed_size = 0;
        stack0xffffffffffffffb8->unp_size = 0;
        stack0xffffffffffffffb8->mtime = 0;
        stack0xffffffffffffffb8->ctime = 0;
        stack0xffffffffffffffb8->atime = 0;
        stack0xffffffffffffffb8->arctime = 0;
        stack0xffffffffffffffb8->mode = 0;
        memset(stack0xffffffffffffffb8->salt,0,8);
        stack0xffffffffffffffb8->atime = 0;
        stack0xffffffffffffffb8->ansec = 0;
        stack0xffffffffffffffb8->ctime = 0;
        stack0xffffffffffffffb8->cnsec = 0;
        stack0xffffffffffffffb8->mtime = 0;
        stack0xffffffffffffffb8->mnsec = 0;
        stack0xffffffffffffffb8->arctime = 0;
        stack0xffffffffffffffb8->arcnsec = 0;
        piVar13 = (int64_t *)__archive_read_ahead(a,_end - 7,(ssize_t *)0x0);
        if (piVar13 == (int64_t *)0x0) {
          a_local._4_4_ = -0x1e;
        }
        else {
          uVar3 = crc32(uVar5,piVar13,uVar3 - 7);
          uVar4 = archive_le16dec(&file_header.unp_ver);
          if (uVar3 == uVar4) {
            rar = (rar *)((long)piVar13 + (_end - 7));
            header_size = *piVar13;
            file_header._0_8_ = piVar13[1];
            iVar2 = piVar13[2];
            file_header.file_time[3] = (char)piVar13[3];
            endp = (char *)((long)piVar13 + 0x19);
            file_header.file_crc[1] = (char)((ulong)iVar2 >> 0x10);
            stack0xffffffffffffffb8->compression_method = file_header.file_crc[1];
            file_header._8_8_ = iVar2;
            uVar6 = archive_le32dec(file_header.unp_size + 1);
            tVar14 = get_time(uVar6);
            stack0xffffffffffffffb8->mtime = tVar14;
            uVar6 = archive_le32dec(file_header.pack_size + 1);
            stack0xffffffffffffffb8->file_crc = (ulong)uVar6;
            if ((stack0xffffffffffffffb8->file_flags & 4) != 0) {
              archive_entry_set_is_data_encrypted(entry,'\x01');
              stack0xffffffffffffffb8->has_encrypted_entries = 1;
              archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
            }
            iVar2 = header_size;
            if ((stack0xffffffffffffffb8->file_flags & 0x100) == 0) {
              uVar6 = archive_le32dec(&header_size);
              stack0xffffffffffffffb8->packed_size = (ulong)uVar6;
              uVar6 = archive_le32dec((void *)((long)&header_size + 4));
              stack0xffffffffffffffb8->unp_size = (ulong)uVar6;
            }
            else {
              if (rar < (rar *)((long)piVar13 + 0x21U)) {
                archive_set_error(&a->archive,0x54,"Invalid header size");
                return -0x1e;
              }
              unp_size[0] = (char)header_size;
              unp_size[1] = header_size._1_1_;
              unp_size[2] = header_size._2_1_;
              unp_size[3] = header_size._3_1_;
              unp_size._4_4_ = *(undefined4 *)endp;
              header_size._4_4_ = SUB84(iVar2,4);
              local_98 = header_size._4_4_;
              ttime = *(int *)((long)piVar13 + 0x1d);
              endp = (char *)((long)piVar13 + 0x21);
              header_size = iVar2;
              uVar15 = archive_le64dec(unp_size);
              stack0xffffffffffffffb8->packed_size = uVar15;
              uVar15 = archive_le64dec(&local_98);
              stack0xffffffffffffffb8->unp_size = uVar15;
            }
            if ((stack0xffffffffffffffb8->packed_size < 0) ||
               (stack0xffffffffffffffb8->unp_size < 0)) {
              archive_set_error(&a->archive,0x54,"Invalid sizes specified.");
              a_local._4_4_ = -0x1e;
            }
            else {
              stack0xffffffffffffffb8->bytes_remaining = stack0xffffffffffffffb8->packed_size;
              if (head_type == 'z') {
                _end = stack0xffffffffffffffb8->packed_size + _end;
                pvVar16 = __archive_read_ahead(a,_end - 7,(ssize_t *)0x0);
                if (pvVar16 == (void *)0x0) {
                  return -0x1e;
                }
                rar = (rar *)((long)pvVar16 + (_end - 7));
                endp = (char *)(((long)endp - (long)piVar13) + (long)pvVar16);
              }
              uVar3 = archive_le16dec(file_header.file_crc + 2);
              uVar22 = (uint)uVar3;
              if (rar < (rar *)(endp + uVar22)) {
                archive_set_error(&a->archive,0x54,"Invalid filename size");
                a_local._4_4_ = -0x1e;
              }
              else {
                if (stack0xffffffffffffffb8->filename_allocated < (ulong)(uVar22 * 2 + 2)) {
                  uVar17 = (ulong)(uVar22 * 2 + 2);
                  pcVar18 = (char *)realloc(stack0xffffffffffffffb8->filename,uVar17);
                  if (pcVar18 == (char *)0x0) {
                    archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                    return -0x1e;
                  }
                  stack0xffffffffffffffb8->filename = pcVar18;
                  stack0xffffffffffffffb8->filename_allocated = uVar17;
                }
                __s = (char  [8])stack0xffffffffffffffb8->filename;
                memcpy((void *)__s,endp,(ulong)uVar22);
                *(char *)((long)__s + (ulong)uVar22) = '\0';
                cp = uVar22;
                filename._4_4_ = uVar22;
                if ((stack0xffffffffffffffb8->file_flags & 0x200) == 0) {
                  _crc32_read = fn_sconv;
                  while (pcVar18 = strchr((char *)__s,0x5c), pcVar18 != (char *)0x0) {
                    *pcVar18 = '/';
                  }
                }
                else {
                  sVar19 = strlen((char *)__s);
                  if (uVar22 == sVar19) {
                    if (stack0xffffffffffffffb8->sconv_utf8 == (archive_string_conv *)0x0) {
                      paVar11 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
                      stack0xffffffffffffffb8->sconv_utf8 = paVar11;
                      if (stack0xffffffffffffffb8->sconv_utf8 == (archive_string_conv *)0x0) {
                        return -0x1e;
                      }
                    }
                    _crc32_read = stack0xffffffffffffffb8->sconv_utf8;
                    while (pcVar18 = strchr((char *)__s,0x5c), pcVar18 != (char *)0x0) {
                      *pcVar18 = '/';
                    }
                  }
                  else {
                    uVar7 = uVar22 << 1;
                    filename._4_4_ = 0;
                    sVar19 = strlen((char *)__s);
                    uVar8 = (int)sVar19 + 1;
                    if (uVar8 < uVar22) {
                      cp = (int)sVar19 + 2;
                      cVar1 = endp[uVar8];
                    }
                    else {
                      cVar1 = '\0';
                      cp = uVar8;
                    }
                    offset._2_1_ = 0;
                    offset._1_1_ = 0;
                    uVar8 = cp;
switchD_00145bf6_default:
                    cp = uVar8;
                    local_105 = cp < uVar22 && filename._4_4_ < uVar7;
                    if (local_105) {
                      if (offset._2_1_ == 0) {
                        offset._1_1_ = endp[cp];
                        offset._2_1_ = 8;
                        cp = cp + 1;
                      }
                      offset._2_1_ = offset._2_1_ - 2;
                      uVar8 = cp;
                      switch(offset._1_1_ >> (offset._2_1_ & 0x1f) & 3) {
                      case 0:
                        if (cp < uVar22) {
                          uVar8 = filename._4_4_ + 1;
                          *(char *)((long)__s + (ulong)filename._4_4_) = '\0';
                          filename._4_4_ = filename._4_4_ + 2;
                          *(char *)((long)__s + (ulong)uVar8) = endp[cp];
                          uVar8 = cp + 1;
                        }
                        break;
                      case 1:
                        if (cp < uVar22) {
                          uVar8 = filename._4_4_ + 1;
                          *(char *)((long)__s + (ulong)filename._4_4_) = cVar1;
                          filename._4_4_ = filename._4_4_ + 2;
                          *(char *)((long)__s + (ulong)uVar8) = endp[cp];
                          uVar8 = cp + 1;
                        }
                        break;
                      case 2:
                        uVar8 = uVar22;
                        if (cp < uVar22 - 1) {
                          uVar8 = filename._4_4_ + 1;
                          *(char *)((long)__s + (ulong)filename._4_4_) = endp[(ulong)cp + 1];
                          filename._4_4_ = filename._4_4_ + 2;
                          *(char *)((long)__s + (ulong)uVar8) = endp[cp];
                          uVar8 = cp + 2;
                        }
                        break;
                      case 3:
                        if (cp < uVar22) {
                          uVar8 = cp + 1;
                          uVar17 = (ulong)cp;
                          if ((endp[uVar17] & 0x80U) == 0) {
                            local_e6 = '\0';
                            local_e5 = '\0';
                            cp = uVar8;
                          }
                          else {
                            if (uVar22 <= uVar8) break;
                            local_e5 = endp[uVar8];
                            local_e6 = cVar1;
                            cp = cp + 2;
                          }
                          for (local_e7 = (endp[uVar17] & 0x7fU) + 2; uVar8 = cp,
                              local_e7 != '\0' && filename._4_4_ < uVar7; local_e7 = local_e7 + -1)
                          {
                            uVar8 = filename._4_4_ >> 1;
                            uVar23 = filename._4_4_ + 1;
                            *(char *)((long)__s + (ulong)filename._4_4_) = local_e6;
                            filename._4_4_ = filename._4_4_ + 2;
                            *(char *)((long)__s + (ulong)uVar23) = endp[uVar8] + local_e5;
                          }
                          break;
                        }
                      }
                      goto switchD_00145bf6_default;
                    }
                    if (uVar7 < filename._4_4_) {
                      archive_set_error(&a->archive,0x54,"Invalid filename");
                      return -0x1e;
                    }
                    uVar22 = filename._4_4_ + 1;
                    *(char *)((long)__s + (ulong)filename._4_4_) = '\0';
                    *(char *)((long)__s + (ulong)uVar22) = '\0';
                    if (stack0xffffffffffffffb8->sconv_utf16be == (archive_string_conv *)0x0) {
                      paVar11 = archive_string_conversion_from_charset
                                          (&a->archive,"UTF-16BE",L'\x01');
                      stack0xffffffffffffffb8->sconv_utf16be = paVar11;
                      if (stack0xffffffffffffffb8->sconv_utf16be == (archive_string_conv *)0x0) {
                        return -0x1e;
                      }
                    }
                    _crc32_read = stack0xffffffffffffffb8->sconv_utf16be;
                    for (packed_size = __s; filename._4_4_ = uVar22, *(short *)packed_size != 0;
                        packed_size = (char  [8])((long)packed_size + 2)) {
                      if (*(short *)packed_size == 0x5c00) {
                        *(undefined1 *)((long)packed_size + 1) = 0x2f;
                      }
                    }
                  }
                }
                endp = endp + cp;
                if (((stack0xffffffffffffffb8->filename_save == (char *)0x0) ||
                    ((ulong)filename._4_4_ != stack0xffffffffffffffb8->filename_save_size)) ||
                   (iVar9 = memcmp(stack0xffffffffffffffb8->filename,
                                   stack0xffffffffffffffb8->filename_save,
                                   (ulong)(filename._4_4_ + 1)), iVar9 != 0)) {
                  if (stack0xffffffffffffffb8->filename_must_match == '\0') {
                    pcVar18 = (char *)realloc(stack0xffffffffffffffb8->filename_save,
                                              (ulong)(filename._4_4_ + 1));
                    if (pcVar18 == (char *)0x0) {
                      archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                      a_local._4_4_ = -0x1e;
                    }
                    else {
                      stack0xffffffffffffffb8->filename_save = pcVar18;
                      memcpy(stack0xffffffffffffffb8->filename_save,
                             stack0xffffffffffffffb8->filename,(ulong)(filename._4_4_ + 1));
                      stack0xffffffffffffffb8->filename_save_size = (ulong)filename._4_4_;
                      free(stack0xffffffffffffffb8->dbo);
                      pdVar20 = (data_block_offsets *)calloc(1,0x18);
                      stack0xffffffffffffffb8->dbo = pdVar20;
                      if (pdVar20 == (data_block_offsets *)0x0) {
                        archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                        a_local._4_4_ = -0x1e;
                      }
                      else {
                        stack0xffffffffffffffb8->dbo->header_size = _end;
                        stack0xffffffffffffffb8->dbo->start_offset = -1;
                        stack0xffffffffffffffb8->dbo->end_offset = -1;
                        stack0xffffffffffffffb8->cursor = 0;
                        stack0xffffffffffffffb8->nodes = 1;
                        if ((stack0xffffffffffffffb8->file_flags & 0x400) != 0) {
                          if (rar < (rar *)(endp + 8)) {
                            archive_set_error(&a->archive,0x54,"Invalid header size");
                            return -0x1e;
                          }
                          *(undefined8 *)stack0xffffffffffffffb8->salt = *(undefined8 *)endp;
                          endp = endp + 8;
                        }
                        if (((stack0xffffffffffffffb8->file_flags & 0x1000) == 0) ||
                           (iVar9 = read_exttime(endp,stack0xffffffffffffffb8,(char *)rar),
                           -1 < iVar9)) {
                          __archive_read_consume(a,_end - 7);
                          stack0xffffffffffffffb8->dbo->start_offset = a->filter->position;
                          stack0xffffffffffffffb8->dbo->end_offset =
                               stack0xffffffffffffffb8->dbo->start_offset +
                               stack0xffffffffffffffb8->packed_size;
                          if ((uint)(int)file_header.pack_size[0] < 3) {
                            uVar6 = archive_le32dec(file_header.file_time);
                            stack0xffffffffffffffb8->mode = uVar6;
                            if ((stack0xffffffffffffffb8->mode & 0x10) == 0) {
                              stack0xffffffffffffffb8->mode = 0x8000;
                            }
                            else {
                              stack0xffffffffffffffb8->mode = 0x4049;
                            }
                            stack0xffffffffffffffb8->mode = stack0xffffffffffffffb8->mode | 0x1a4;
                          }
                          else {
                            if (2 < (int)file_header.pack_size[0] - 3U) {
                              archive_set_error(&a->archive,0x54,
                                                "Unknown file attributes from RAR file\'s host OS");
                              return -0x1e;
                            }
                            uVar6 = archive_le32dec(file_header.file_time);
                            stack0xffffffffffffffb8->mode = uVar6;
                          }
                          stack0xffffffffffffffb8->bytes_unconsumed = 0;
                          stack0xffffffffffffffb8->bytes_uncopied = 0;
                          stack0xffffffffffffffb8->offset = 0;
                          (stack0xffffffffffffffb8->lzss).position = 0;
                          stack0xffffffffffffffb8->offset_seek = 0;
                          stack0xffffffffffffffb8->dictionary_size = 0;
                          stack0xffffffffffffffb8->offset_outgoing = 0;
                          (stack0xffffffffffffffb8->br).cache_avail = 0;
                          (stack0xffffffffffffffb8->br).avail_in = 0;
                          stack0xffffffffffffffb8->crc_calculated = 0;
                          stack0xffffffffffffffb8->entry_eof = '\0';
                          stack0xffffffffffffffb8->valid = '\x01';
                          stack0xffffffffffffffb8->is_ppmd_block = '\0';
                          stack0xffffffffffffffb8->start_new_table = '\x01';
                          free(stack0xffffffffffffffb8->unp_buffer);
                          stack0xffffffffffffffb8->unp_buffer = (uchar *)0x0;
                          stack0xffffffffffffffb8->unp_offset = 0;
                          stack0xffffffffffffffb8->unp_buffer_size = 0x20000;
                          memset(stack0xffffffffffffffb8->lengthtable,0,0x194);
                          Ppmd7_Free(&stack0xffffffffffffffb8->ppmd7_context);
                          stack0xffffffffffffffb8->ppmd_eod = '\0';
                          stack0xffffffffffffffb8->ppmd_valid = '\0';
                          (stack0xffffffffffffffb8->filters).filterstart = 0x7fffffffffffffff;
                          if (head_type == 'z') {
                            a_local._4_4_ = 0;
                          }
                          else {
                            archive_entry_set_mtime
                                      (entry,stack0xffffffffffffffb8->mtime,
                                       stack0xffffffffffffffb8->mnsec);
                            archive_entry_set_ctime
                                      (entry,stack0xffffffffffffffb8->ctime,
                                       stack0xffffffffffffffb8->cnsec);
                            archive_entry_set_atime
                                      (entry,stack0xffffffffffffffb8->atime,
                                       stack0xffffffffffffffb8->ansec);
                            archive_entry_set_size(entry,stack0xffffffffffffffb8->unp_size);
                            archive_entry_set_mode(entry,stack0xffffffffffffffb8->mode);
                            wVar10 = _archive_entry_copy_pathname_l
                                               (entry,(char *)__s,(ulong)filename._4_4_,_crc32_read)
                            ;
                            if (wVar10 != L'\0') {
                              piVar21 = __errno_location();
                              if (*piVar21 == 0xc) {
                                archive_set_error(&a->archive,0xc,
                                                  "Can\'t allocate memory for Pathname");
                                return -0x1e;
                              }
                              pcVar18 = archive_string_conversion_charset_name(_crc32_read);
                              archive_set_error(&a->archive,0x54,
                                                "Pathname cannot be converted from %s to current locale."
                                                ,pcVar18);
                              newptr._4_4_ = -0x14;
                            }
                            if ((stack0xffffffffffffffb8->mode & 0xf000) == 0xa000) {
                              stack0xffffffffffffffb8->bytes_remaining = 0;
                              archive_entry_set_size(entry,0);
                              iVar9 = read_symlink_stored(a,entry,fn_sconv);
                              if (iVar9 < -0x14) {
                                return iVar9;
                              }
                              if (iVar9 < newptr._4_4_) {
                                newptr._4_4_ = iVar9;
                              }
                            }
                            if (stack0xffffffffffffffb8->bytes_remaining == 0) {
                              stack0xffffffffffffffb8->entry_eof = '\x01';
                            }
                            a_local._4_4_ = newptr._4_4_;
                          }
                        }
                        else {
                          archive_set_error(&a->archive,0x54,"Invalid header size");
                          a_local._4_4_ = -0x1e;
                        }
                      }
                    }
                  }
                  else {
                    archive_set_error(&a->archive,0x54,
                                      "Mismatch of file parts split across multi-volume archive");
                    a_local._4_4_ = -0x1e;
                  }
                }
                else {
                  __archive_read_consume(a,_end - 7);
                  stack0xffffffffffffffb8->cursor = stack0xffffffffffffffb8->cursor + 1;
                  if (stack0xffffffffffffffb8->nodes <= stack0xffffffffffffffb8->cursor) {
                    pdVar20 = (data_block_offsets *)
                              realloc(stack0xffffffffffffffb8->dbo,
                                      (ulong)(stack0xffffffffffffffb8->nodes + 1) * 0x18);
                    if (pdVar20 == (data_block_offsets *)0x0) {
                      archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                      return -0x1e;
                    }
                    stack0xffffffffffffffb8->dbo = pdVar20;
                    stack0xffffffffffffffb8->nodes = stack0xffffffffffffffb8->nodes + 1;
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].header_size = _end
                    ;
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].start_offset = -1;
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].end_offset = -1;
                  }
                  if (stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].start_offset < 0
                     ) {
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].start_offset =
                         a->filter->position;
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].end_offset =
                         stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].start_offset
                         + stack0xffffffffffffffb8->packed_size;
                  }
                  a_local._4_4_ = 0;
                }
              }
            }
          }
          else {
            archive_set_error(&a->archive,0x54,"Header CRC error");
            a_local._4_4_ = -0x1e;
          }
        }
      }
      else {
        archive_set_error(&a->archive,0x54,"RAR solid archive support unavailable.");
        a_local._4_4_ = -0x1e;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  uint32_t crc32_computed, crc32_read;
  int ret = (ARCHIVE_OK), ret2;
  char *newptr;
  size_t newsize;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_computed = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_computed = crc32(crc32_computed, h, (unsigned)(header_size - 7));
  crc32_read = archive_le16dec(rar_header.crc);
  if ((crc32_computed & 0xffff) != crc32_read) {
#ifndef DONT_FAIL_ON_CRC_ERROR
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
#endif
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = offset >= end ? 0 : *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            if (offset >= end)
              continue;
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            if (offset >= end)
              continue;
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            if (offset >= end - 1) {
              offset = end;
              continue;
            }
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length;

            if (offset >= end)
              continue;

            length = *(p + offset++);
            if (length & 0x80) {
              if (offset >= end)
                continue;
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      /*
       * Do not increment filename_size here as the computations below
       * add the space for the terminating NUL explicitly.
       */
      filename[filename_size] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      struct data_block_offsets *newdbo;

      newsize = sizeof(*rar->dbo) * (rar->nodes + 1);
      if ((newdbo = realloc(rar->dbo, newsize)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo = newdbo;
      rar->nodes++;
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }
  else if (rar->filename_must_match)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Mismatch of file parts split across multi-volume archive");
    return (ARCHIVE_FATAL);
  }

  newsize = filename_size + 1;
  if ((newptr = realloc(rar->filename_save, newsize)) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->filename_save = newptr;
  memcpy(rar->filename_save, rar->filename, newsize);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  rar->ppmd_valid = rar->ppmd_eod = 0;
  rar->filters.filterstart = INT64_MAX;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}